

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O1

bool __thiscall GGSock::FileServer::update(FileServer *this)

{
  byte bVar1;
  undefined8 *puVar2;
  size_t __n;
  Communicator *this_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int __flags;
  ulong in_R8;
  undefined4 uVar12;
  long lVar13;
  pthread_mutex_t *ppVar14;
  long lVar15;
  long lVar16;
  SerializationBuffer buffer;
  size_t offset;
  FileChunkResponseData fileChunkToSend;
  char local_dc;
  TAddress local_d8;
  long local_b0;
  ulong local_a8;
  undefined4 local_9c;
  FileServer *local_98;
  Serialize local_90;
  size_t local_88;
  undefined1 local_80 [40];
  pointer local_58;
  pointer pcStack_50;
  pointer local_48;
  long lStack_40;
  ulong local_38;
  
  local_80._0_8_ = local_80 + 0x10;
  local_80._8_8_ = 0;
  local_80[0x10] = '\0';
  local_80._32_4_ = 0;
  local_58 = (pointer)0x0;
  pcStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  lStack_40 = 0;
  local_38 = 0;
  ppVar14 = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  iVar5 = pthread_mutex_lock(ppVar14);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  _Var6._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  if ((_Var6._M_head_impl)->changedFileInfos == true) {
    Impl::updateFileInfos(_Var6._M_head_impl);
    ((this->m_impl)._M_t.
     super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
     ._M_t.
     super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
     .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->changedFileInfos =
         false;
  }
  _Var6._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  if ((_Var6._M_head_impl)->changedClientInfos == true) {
    Impl::updateClientInfos(_Var6._M_head_impl);
    ((this->m_impl)._M_t.
     super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
     ._M_t.
     super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
     .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->changedClientInfos =
         false;
  }
  __flags = (int)in_R8;
  _Var6._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  uVar9 = (ulong)(_Var6._M_head_impl)->currentClientUpdateId;
  iVar5 = (_Var6._M_head_impl)->currentClientUpdateId + 1;
  (_Var6._M_head_impl)->currentClientUpdateId = iVar5;
  lVar16 = *(long *)&((_Var6._M_head_impl)->clients).
                     super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>;
  uVar8 = ((long)*(pointer *)((long)&(_Var6._M_head_impl)->clients + 8) - lVar16 >> 3) *
          -0x30c30c30c30c30c3;
  if (iVar5 == (int)uVar8) {
    (_Var6._M_head_impl)->currentClientUpdateId = 0;
  }
  if (uVar8 < uVar9 || uVar8 - uVar9 == 0) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  else {
    lVar13 = uVar9 * 0xa8;
    bVar1 = *(byte *)(lVar16 + 0x40 + lVar13);
    local_a8 = uVar9;
    if (bVar1 == 0) {
      lVar16 = lVar16 + lVar13;
      local_dc = (_Var6._M_head_impl)->isListening;
      local_9c = (undefined4)
                 CONCAT71((int7)((ulong)_Var6._M_head_impl >> 8),*(undefined1 *)(lVar16 + 0x42));
      *(undefined1 *)(lVar16 + 0x42) = 0;
      puVar2 = *(undefined8 **)(lVar16 + 0x58);
      local_b0 = lVar13;
      if ((*(long *)(lVar16 + 0x78) - *(long *)(lVar16 + 0x80) >> 4) * -0x5555555555555555 +
          ((*(long *)(lVar16 + 0x90) - *(long *)(lVar16 + 0x70) >> 3) + -1 +
          (ulong)(*(long *)(lVar16 + 0x90) == 0)) * 10 ==
          (*(long *)(lVar16 + 0x68) - (long)puVar2 >> 4) * 0x5555555555555555) {
        bVar3 = false;
      }
      else {
        std::__cxx11::string::_M_assign((string *)local_80);
        __flags = (int)in_R8;
        local_80._32_4_ = *(undefined4 *)(puVar2 + 4);
        _Var6._M_head_impl =
             (this->m_impl)._M_t.
             super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
             .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
        lVar13 = *(long *)&((_Var6._M_head_impl)->files).
                           super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                           ._M_impl;
        if ((int)((ulong)((long)*(pointer *)((long)&(_Var6._M_head_impl)->files + 8) - lVar13) >> 3)
            * -0x3b13b13b < 1) {
          bVar3 = false;
        }
        else {
          lVar15 = 0x58;
          uVar8 = 0;
          bVar3 = false;
          local_98 = this;
          do {
            if ((*(ulong *)(*(long *)&((_Var6._M_head_impl)->fileUsed).
                                      super__Bvector_base<std::allocator<bool>_>._M_impl +
                           (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) & 1) != 0) {
              __n = *(size_t *)(lVar13 + -0x50 + lVar15);
              bVar4 = true;
              if (__n == puVar2[1]) {
                if (__n == 0) {
                  bVar4 = false;
                }
                else {
                  iVar5 = bcmp(*(void **)(lVar13 + -0x58 + lVar15),(void *)*puVar2,__n);
                  bVar4 = iVar5 != 0;
                }
              }
              if (!bVar4) {
                lVar10 = *(long *)(lVar13 + -8 + lVar15);
                uVar7 = *(long *)(lVar13 + lVar15) - lVar10;
                iVar5 = *(int *)(lVar13 + -0x10 + lVar15);
                uVar9 = uVar7 / (ulong)(long)iVar5;
                lStack_40 = (long)(int)*(uint *)(puVar2 + 4) * uVar9;
                uVar11 = iVar5 - 1;
                in_R8 = (ulong)uVar11;
                local_38 = uVar7 - lStack_40;
                if (*(uint *)(puVar2 + 4) != uVar11) {
                  local_38 = uVar9;
                }
                lVar10 = lStack_40 + lVar10;
                bVar3 = true;
                std::vector<char,std::allocator<char>>::
                _M_assign_aux<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                          ((vector<char,std::allocator<char>> *)&local_58,lVar10,local_38 + lVar10);
              }
              __flags = (int)in_R8;
              this = local_98;
              if (!bVar4) break;
            }
            __flags = (int)in_R8;
            uVar8 = uVar8 + 1;
            _Var6._M_head_impl =
                 (local_98->m_impl)._M_t.
                 super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                 .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
            lVar13 = *(long *)&((_Var6._M_head_impl)->files).
                               super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
            ;
            lVar15 = lVar15 + 0x68;
            this = local_98;
          } while ((long)uVar8 <
                   (long)((int)((ulong)((long)*(pointer *)((long)&(_Var6._M_head_impl)->files + 8) -
                                       lVar13) >> 3) * -0x3b13b13b));
        }
        std::
        deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
        ::pop_front((deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
                     *)(lVar16 + 0x48));
      }
      lVar13 = local_b0;
      *(undefined1 *)(lVar16 + 0x40) = 1;
      if ((*(char *)(lVar16 + 0x43) == '\x01') &&
         (bVar4 = Communicator::isConnected(*(Communicator **)(lVar16 + 0x98)), !bVar4)) {
        printf("Client %d has disconnected\n",local_a8);
        *(undefined1 *)(lVar16 + 0x43) = 0;
        Impl::updateClientInfos
                  ((this->m_impl)._M_t.
                   super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                   .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl);
      }
      uVar12 = local_9c;
      if ((*(char *)(lVar16 + 0x43) == '\0') &&
         (bVar4 = Communicator::isConnected(*(Communicator **)(lVar16 + 0x98)), uVar12 = local_9c,
         bVar4)) {
        printf("Client %d has connected\n",local_a8);
        *(undefined1 *)(lVar16 + 0x43) = 1;
        Communicator::getPeerAddress_abi_cxx11_(&local_d8,*(Communicator **)(lVar16 + 0x98));
        std::__cxx11::string::operator=((string *)(lVar16 + 8),(string *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        Impl::updateClientInfos
                  ((this->m_impl)._M_t.
                   super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                   .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl);
        lVar13 = local_b0;
        uVar12 = local_9c;
      }
    }
    else {
      bVar3 = false;
      local_dc = '\0';
      uVar12 = 0;
    }
    pthread_mutex_unlock(ppVar14);
    if (bVar1 != 0) {
LAB_0010ce88:
      if (local_58 != (pointer)0x0) {
        operator_delete(local_58,(long)local_48 - (long)local_58);
      }
      if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
        operator_delete((void *)local_80._0_8_,CONCAT71(local_80._17_7_,local_80[0x10]) + 1);
      }
      return (bool)(bVar1 ^ 1);
    }
    _Var6._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
    lVar16 = *(long *)&((_Var6._M_head_impl)->clients).
                       super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>;
    uVar8 = ((long)*(pointer *)((long)&(_Var6._M_head_impl)->clients + 8) - lVar16 >> 3) *
            -0x30c30c30c30c30c3;
    if (local_a8 <= uVar8 && uVar8 - local_a8 != 0) {
      this_00 = *(Communicator **)(lVar16 + 0x98 + lVar13);
      if (local_dc == '\0') {
        Communicator::stopListening(this_00);
      }
      else {
        Communicator::listen(this_00,*(TPort *)((long)&(_Var6._M_head_impl)->parameters + 0x10),0);
      }
      lVar16 = lVar16 + lVar13;
      if ((char)uVar12 != '\0') {
        local_d8._M_dataplus._M_p = (pointer)0x0;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_allocated_capacity = 0;
        local_90.nBytesProcessed = 0;
        local_88 = 0;
        Serialize::operator()
                  (&local_90,
                   &((this->m_impl)._M_t.
                     super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                     .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->
                    fileInfos,(SerializationBuffer *)&local_d8,&local_88);
        Communicator::send(*(Communicator **)(lVar16 + 0x98),0x65,local_d8._M_dataplus._M_p,
                           (ulong)(uint)((int)local_d8._M_string_length -
                                        (int)local_d8._M_dataplus._M_p),__flags);
        Communicator::update(*(Communicator **)(lVar16 + 0x98));
        if (local_d8._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_d8._M_dataplus._M_p,
                          local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
        }
      }
      if (bVar3) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_allocated_capacity = 0;
        local_90.nBytesProcessed = 0;
        local_88 = 0;
        Serialize::operator()
                  (&local_90,(FileChunkResponseData *)local_80,(SerializationBuffer *)&local_d8,
                   &local_88);
        Communicator::send(*(Communicator **)(lVar16 + 0x98),0x67,local_d8._M_dataplus._M_p,
                           (ulong)(uint)((int)local_d8._M_string_length -
                                        (int)local_d8._M_dataplus._M_p),__flags);
        Communicator::update(*(Communicator **)(lVar16 + 0x98));
        if (local_d8._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_d8._M_dataplus._M_p,
                          local_d8.field_2._M_allocated_capacity - (long)local_d8._M_dataplus._M_p);
        }
      }
      Communicator::update(*(Communicator **)(lVar16 + 0x98));
      ppVar14 = (pthread_mutex_t *)
                &((this->m_impl)._M_t.
                  super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                  .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
      iVar5 = pthread_mutex_lock(ppVar14);
      if (iVar5 == 0) {
        *(undefined1 *)
         (*(long *)&(((this->m_impl)._M_t.
                      super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                      .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->
                    clients).
                    super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_> +
          0x40 + lVar13) = 0;
        pthread_mutex_unlock(ppVar14);
        goto LAB_0010ce88;
      }
      goto LAB_0010cefa;
    }
  }
  iVar5 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0010cefa:
  std::__throw_system_error(iVar5);
}

Assistant:

bool FileServer::update() {
    bool doListen = false;
    bool doSendFileInfos = false;
    bool doSendFileChunk = false;

    FileChunkResponseData fileChunkToSend;

    TClientId updateId = -1;

    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        if (m_impl->changedFileInfos) {
            m_impl->updateFileInfos();
            m_impl->changedFileInfos = false;
        }

        if (m_impl->changedClientInfos) {
            m_impl->updateClientInfos();
            m_impl->changedClientInfos = false;
        }

        updateId = m_impl->currentClientUpdateId;

        if (++m_impl->currentClientUpdateId == (int) m_impl->clients.size()) {
            m_impl->currentClientUpdateId = 0;
        }

        auto & client = m_impl->clients.at(updateId);

        if (client.isUpdating) {
            return false;
        }

        doListen = m_impl->isListening;

        doSendFileInfos = client.sendFileInfos;
        client.sendFileInfos = false;

        if (client.fileChunkRequests.size() > 0) {
            const auto & req = client.fileChunkRequests.front();

            // todo : data checks
            fileChunkToSend.uri = req.uri;
            fileChunkToSend.chunkId = req.chunkId;
            for (int i = 0; i < (int) m_impl->files.size(); ++i) {
                if (m_impl->fileUsed[i] == false) {
                    continue;
                }

                const auto & file = m_impl->files[i];
                if (file.info.uri != req.uri) {
                    continue;
                }

                auto chunkSize = file.data.size()/file.info.nChunks;

                int64_t pStart = req.chunkId*chunkSize;
                int64_t pLen = req.chunkId == (file.info.nChunks - 1) ? file.data.size() - pStart : chunkSize;

                fileChunkToSend.pStart = pStart;
                fileChunkToSend.pLen = pLen;
                fileChunkToSend.data.assign(file.data.begin() + pStart, file.data.begin() + pStart + pLen);

                doSendFileChunk = true;

                break;
            }

            client.fileChunkRequests.pop_front();
        }

        client.isUpdating = true;

        if (client.wasConnected && client.communicator->isConnected() == false) {
            printf("Client %d has disconnected\n", updateId);
            client.wasConnected = false;
            m_impl->updateClientInfos();
        }

        if (client.wasConnected == false && client.communicator->isConnected()) {
            printf("Client %d has connected\n", updateId);
            client.wasConnected = true;
            client.info.address = client.communicator->getPeerAddress();
            m_impl->updateClientInfos();
        }
    }

    {
        auto & client = m_impl->clients.at(updateId);
        if (doListen) {
            client.communicator->listen(m_impl->parameters.listenPort, 0);
        } else {
            client.communicator->stopListening();
        }
        if (doSendFileInfos) {
            SerializationBuffer buffer;
            Serialize()(m_impl->fileInfos, buffer);
            client.communicator->send(MsgFileInfosResponse, buffer.data(), (int) buffer.size());
            client.communicator->update();
        }
        if (doSendFileChunk) {
            SerializationBuffer buffer;
            Serialize()(fileChunkToSend, buffer);
            client.communicator->send(MsgFileChunkResponse, buffer.data(), (int) buffer.size());
            client.communicator->update();
        }
        client.communicator->update();
    }

    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);
        m_impl->clients[updateId].isUpdating = false;
    }

    return true;
}